

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::
emplace<QOpenGLProgramBinaryCache::ShaderDesc>
          (QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *this,qsizetype i,
          ShaderDesc *args)

{
  qsizetype *pqVar1;
  ShaderDesc **ppSVar2;
  Stage SVar3;
  Data *pDVar4;
  ShaderDesc *pSVar5;
  QArrayData *pQVar6;
  char *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Inserter local_a8;
  ShaderDesc local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0057c284:
    SVar3 = args->stage;
    local_58._4_4_ = 0xaaaaaaaa;
    local_58.stage = SVar3;
    pQVar6 = &((args->source).d.d)->super_QArrayData;
    (args->source).d.d = (Data *)0x0;
    pcVar7 = (args->source).d.ptr;
    (args->source).d.ptr = (char *)0x0;
    qVar8 = (args->source).d.size;
    (args->source).d.size = 0;
    bVar10 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size != 0;
    local_58.source.d.d = (Data *)pQVar6;
    local_58.source.d.ptr = pcVar7;
    local_58.source.d.size = qVar8;
    QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::detachAndGrow
              (&this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>,
               (uint)(i == 0 && bVar10),1,(ShaderDesc **)0x0,
               (QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> *)0x0);
    if (i != 0 || !bVar10) {
      local_a8.sourceCopyConstruct = 0;
      local_a8.nSource = 0;
      local_a8.move = 0;
      local_a8.sourceCopyAssign = 0;
      local_a8.end = (ShaderDesc *)0x0;
      local_a8.last = (ShaderDesc *)0x0;
      local_a8.where = (ShaderDesc *)0x0;
      local_a8.begin = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
      local_a8.size = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
      local_a8.data = &this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>;
      Inserter::insertOne(&local_a8,i,&local_58);
      (local_a8.data)->ptr = local_a8.begin;
      (local_a8.data)->size = local_a8.size;
      if (&(local_58.source.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.source.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.source.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_58.source.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_58.source.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0057c393;
    }
    pSVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
    pSVar5[-1].stage = SVar3;
    pSVar5[-1].source.d.d = (Data *)pQVar6;
    pSVar5[-1].source.d.ptr = pcVar7;
    pSVar5[-1].source.d.size = qVar8;
    (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr = pSVar5 + -1;
  }
  else if (((this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size == i) &&
          (pSVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr,
          (pDVar4->super_QArrayData).alloc !=
          ((long)((long)pSVar5 -
                 ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5)
          + i)) {
    pSVar5[i].stage = args->stage;
    pDVar9 = (args->source).d.d;
    (args->source).d.d = (Data *)0x0;
    pSVar5[i].source.d.d = pDVar9;
    pcVar7 = (args->source).d.ptr;
    (args->source).d.ptr = (char *)0x0;
    pSVar5[i].source.d.ptr = pcVar7;
    qVar8 = (args->source).d.size;
    (args->source).d.size = 0;
    pSVar5[i].source.d.size = qVar8;
  }
  else {
    if ((i != 0) ||
       (pSVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr,
       (ShaderDesc *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pSVar5)) goto LAB_0057c284;
    pSVar5[-1].stage = args->stage;
    pDVar9 = (args->source).d.d;
    (args->source).d.d = (Data *)0x0;
    pSVar5[-1].source.d.d = pDVar9;
    pcVar7 = (args->source).d.ptr;
    (args->source).d.ptr = (char *)0x0;
    pSVar5[-1].source.d.ptr = pcVar7;
    qVar8 = (args->source).d.size;
    (args->source).d.size = 0;
    pSVar5[-1].source.d.size = qVar8;
    ppSVar2 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
    *ppSVar2 = *ppSVar2 + -1;
  }
  pqVar1 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
  *pqVar1 = *pqVar1 + 1;
LAB_0057c393:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }